

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.cpp
# Opt level: O3

SidTreeNode * __thiscall
COLLADASaxFWL::DocumentProcessor::resolveSid(DocumentProcessor *this,SidAddress *sidAddress)

{
  pointer pbVar1;
  pointer pbVar2;
  size_t __n;
  int iVar3;
  iterator iVar4;
  SidTreeNode *pSVar5;
  ulong uVar6;
  size_t firstSidIndex;
  ulong uVar7;
  SidTreeNode *this_00;
  
  pSVar5 = (SidTreeNode *)0x0;
  if ((sidAddress->mIsValid == true) && ((sidAddress->mId)._M_string_length != 0)) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::SidTreeNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::SidTreeNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::SidTreeNode_*>_>_>
            ::find(&this->mIdStringSidTreeNodeMap->_M_t,&sidAddress->mId);
    if (((_Rb_tree_header *)iVar4._M_node ==
         &(this->mIdStringSidTreeNodeMap->_M_t)._M_impl.super__Rb_tree_header) ||
       (pSVar5 = *(SidTreeNode **)(iVar4._M_node + 2), pSVar5 == (SidTreeNode *)0x0)) {
      pSVar5 = (SidTreeNode *)0x0;
    }
    else {
      pbVar1 = (sidAddress->mSids).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (sidAddress->mSids).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (((pbVar1 == pbVar2) ||
          (__n = pbVar1->_M_string_length, __n != (pSVar5->mSid)._M_string_length)) ||
         ((__n != 0 &&
          (iVar3 = bcmp((pbVar1->_M_dataplus)._M_p,(pSVar5->mSid)._M_dataplus._M_p,__n), iVar3 != 0)
          ))) {
        firstSidIndex = 0;
      }
      else {
        firstSidIndex = 1;
      }
      uVar7 = (long)pbVar2 - (long)pbVar1 >> 5;
      if (firstSidIndex < uVar7) {
        uVar6 = (ulong)(uint)((int)firstSidIndex << 5);
        this_00 = pSVar5;
        do {
          pSVar5 = SidTreeNode::findChildBySid
                             (this_00,(String *)
                                      ((long)&(((sidAddress->mSids).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + uVar6));
          if (pSVar5 == (SidTreeNode *)0x0) {
            pSVar5 = resolveSidInInstance(this,this_00,sidAddress,firstSidIndex);
            return pSVar5;
          }
          firstSidIndex = firstSidIndex + 1;
          uVar6 = uVar6 + 0x20;
          this_00 = pSVar5;
        } while (uVar7 != firstSidIndex);
      }
    }
  }
  return pSVar5;
}

Assistant:

const SidTreeNode* DocumentProcessor::resolveSid( const SidAddress& sidAddress )
	{
		if ( !sidAddress.isValid() )
			return 0;

		SidTreeNode* startingPoint = 0;
		const String& id = sidAddress.getId();
		if ( !id.empty() )
		{
			// search for element with id 
			startingPoint = findSidTreeNodeByStringId( id );
		}

		if ( !startingPoint )
			return 0;

		SidTreeNode* currentNode = startingPoint;
		const SidAddress::SidList& sids = sidAddress.getSids();

		size_t i = 0;

		if ( !sids.empty() && (sids.front() == startingPoint->getSid()) )
		{
			// the first one is the start element it self exclude it from recursive search
			i = 1;
		}

		for ( size_t count = sids.size(); i < count; ++i)
		{
			const String& currentSid = sids[i];
			SidTreeNode* childNode = currentNode->findChildBySid( currentSid );

			if ( !childNode )
			{
				// we could not find the sid as a child of currentNode
				// lets try if the sid is in an instantiated element
				return resolveSidInInstance( currentNode, sidAddress, i);
			}
			else
			{
				currentNode = childNode;
			}
		}
		return currentNode;
	}